

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_5d7daf::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  ostringstream oss;
  long *local_1b0 [2];
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  if (0.0 < total) {
    lVar1 = this->CurrentPercentage;
    lVar2 = lround((value / total) * 100.0);
    lVar4 = 100;
    if (lVar2 < 100) {
      lVar4 = lVar2;
    }
    this->CurrentPercentage = lVar4;
    if (lVar1 != lVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(this->Text)._M_dataplus._M_p,
                          (this->Text)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"% complete]",0xb);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)status,(string *)local_1b0);
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0],local_1a0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
      return true;
    }
  }
  return false;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      std::ostringstream oss;
      oss << "[" << this->Text << " " << this->CurrentPercentage
          << "% complete]";
      status = oss.str();
    }

    return updated;
  }